

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearize.c
# Opt level: O3

void dmrC_destroy_linearizer(dmr_C *C)

{
  linearizer_state_t *A;
  
  A = C->L;
  if (A != (linearizer_state_t *)0x0) {
    dmrC_allocator_destroy(&A->asm_rules_allocator);
    dmrC_allocator_destroy(&A->pseudo_allocator);
    dmrC_allocator_destroy(&A->pseudo_user_allocator);
    dmrC_allocator_destroy(&A->asm_constraint_allocator);
    dmrC_allocator_destroy(&A->multijmp_allocator);
    dmrC_allocator_destroy(&A->basic_block_allocator);
    dmrC_allocator_destroy(&A->entrypoint_allocator);
    dmrC_allocator_destroy(&A->instruction_allocator);
    free(A);
    C->L = (linearizer_state_t *)0x0;
    return;
  }
  __assert_fail("L",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]dmr_c/src/linearize.c"
                ,0xaaa,"void dmrC_destroy_linearizer(struct dmr_C *)");
}

Assistant:

void dmrC_destroy_linearizer(struct dmr_C *C) {
	struct linearizer_state_t *L = C->L;
	assert(L);
	dmrC_allocator_destroy(&L->asm_rules_allocator);
	dmrC_allocator_destroy(&L->pseudo_allocator);
	dmrC_allocator_destroy(&L->pseudo_user_allocator);
	dmrC_allocator_destroy(&L->asm_constraint_allocator);
	dmrC_allocator_destroy(&L->multijmp_allocator);
	dmrC_allocator_destroy(&L->basic_block_allocator);
	dmrC_allocator_destroy(&L->entrypoint_allocator);
	dmrC_allocator_destroy(&L->instruction_allocator);
	free(L);
	C->L = NULL;
}